

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::init_ssl(torrent *this,string_view cert)

{
  bool bVar1;
  pointer pcVar2;
  native_handle_type this_00;
  alert_manager *this_01;
  error_code *ec_00;
  string_view pem;
  undefined1 local_c0 [20];
  undefined4 local_ac;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_95;
  undefined4 local_94;
  torrent *local_90;
  code *local_88;
  pointer local_80;
  type local_78;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_5c;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_55;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_54;
  undefined1 local_50 [8];
  error_code ec;
  unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_> local_28;
  unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_> ctx;
  torrent *this_local;
  string_view cert_local;
  
  pem._M_len = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cert._M_str;
  ctx._M_t.
  super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>.
  _M_t.
  super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
  .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl =
       (__uniq_ptr_data<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>,_true,_true>
        )(__uniq_ptr_data<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>,_true,_true>
          )this;
  ::std::make_unique<boost::asio::ssl::context,boost::asio::ssl::context_base::method>
            ((method *)&local_28);
  pcVar2 = ::std::
           unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
           operator->(&local_28);
  boost::asio::ssl::context::set_options(pcVar2,0x82000850);
  boost::system::error_code::error_code((error_code *)local_50);
  pcVar2 = ::std::
           unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
           operator->(&local_28);
  boost::asio::ssl::context::set_verify_mode(pcVar2,7,(error_code *)local_50);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_50);
  if (bVar1) {
    local_54.m_val = 0xfffffffd;
    set_error(this,(error_code *)local_50,(file_index_t)0xfffffffd);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
    bitfield_flag(&local_55);
    pause(this);
    local_5c.m_val = 1;
  }
  else {
    pcVar2 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&local_28);
    local_88 = verify_peer_cert;
    local_80 = (pointer)0x0;
    ec_00 = (error_code *)&::std::placeholders::_2;
    local_90 = this;
    ::std::
    bind<bool(libtorrent::aux::torrent::*)(bool,boost::asio::ssl::verify_context&),libtorrent::aux::torrent*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&local_78,(offset_in_torrent_to_subr *)&local_88,&local_90,
               (_Placeholder<1> *)&::std::placeholders::_1,
               (_Placeholder<2> *)&::std::placeholders::_2);
    boost::asio::ssl::context::
    set_verify_callback<std::_Bind<bool(libtorrent::aux::torrent::*(libtorrent::aux::torrent*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,boost::asio::ssl::verify_context&)>>
              (pcVar2,&local_78,(error_code *)local_50);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_50);
    if (bVar1) {
      local_94 = 0xfffffffd;
      set_error(this,(error_code *)local_50,(file_index_t)0xfffffffd);
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
      bitfield_flag(&local_95);
      pause(this);
      local_5c.m_val = 1;
    }
    else {
      pcVar2 = ::std::
               unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               ::operator->(&local_28);
      this_00 = boost::asio::ssl::context::native_handle(pcVar2);
      pem._M_str = local_50;
      local_a8 = (element_type *)cert._M_len;
      _Stack_a0._M_pi = pem._M_len;
      aux::ssl::set_trust_certificate((ssl *)this_00,(native_context_type)cert._M_len,pem,ec_00);
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_50);
      if (bVar1) {
        local_ac = 0xfffffffd;
        set_error(this,(error_code *)local_50,(file_index_t)0xfffffffd);
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
        bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)
                      (local_c0 + 0x13));
        pause(this);
        local_5c.m_val = 1;
      }
      else {
        ::std::
        unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
        operator=(&this->m_ssl_ctx,&local_28);
        this_01 = alerts(this);
        get_handle((torrent *)local_c0);
        alert_manager::emplace_alert<libtorrent::torrent_need_cert_alert,libtorrent::torrent_handle>
                  (this_01,(torrent_handle *)local_c0);
        torrent_handle::~torrent_handle((torrent_handle *)local_c0);
        local_5c.m_val = 0;
      }
    }
  }
  ::std::unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
  ~unique_ptr(&local_28);
  return;
}

Assistant:

void torrent::init_ssl(string_view cert)
	{
		// create the SSL context for this torrent. We need to
		// inject the root certificate, and no other, to
		// verify other peers against
		std::unique_ptr<ssl::context> ctx(std::make_unique<ssl::context>(ssl::context::tls));

		ctx->set_options(ssl::context::default_workarounds
			| ssl::context::no_sslv2
			| ssl::context::no_sslv3
			| ssl::context::single_dh_use);

		error_code ec;
		ctx->set_verify_mode(ssl::context::verify_peer
			| ssl::context::verify_fail_if_no_peer_cert
			| ssl::context::verify_client_once, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

		// the verification function verifies the distinguished name
		// of a peer certificate to make sure it matches the info-hash
		// of the torrent, or that it's a "star-cert"
		ctx->set_verify_callback(
				std::bind(&torrent::verify_peer_cert, this, _1, _2)
				, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

		// set the root certificate as trust
		ssl::set_trust_certificate(ctx->native_handle(), cert, ec);
		if (ec)
		{
			set_error(ec, torrent_status::error_file_ssl_ctx);
			pause();
			return;
		}

#if 0
		char filename[100];
		std::snprintf(filename, sizeof(filename), "/tmp/%u.pem", random());
		FILE* f = fopen(filename, "w+");
		fwrite(cert.c_str(), cert.size(), 1, f);
		fclose(f);
		ctx->load_verify_file(filename);
#endif

		// if all went well, set the torrent ssl context to this one
		m_ssl_ctx = std::move(ctx);
		// tell the client we need a cert for this torrent
		alerts().emplace_alert<torrent_need_cert_alert>(get_handle());
	}